

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Farm.cpp
# Opt level: O1

void __thiscall Farm::editBasket(Farm *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  double dVar4;
  int iVar5;
  Farm *pFVar6;
  bool bVar7;
  ostream *poVar8;
  ulong uVar9;
  _Hash_node_base *p_Var10;
  __node_base_ptr p_Var11;
  __node_base_ptr p_Var12;
  _Hash_node_base *p_Var13;
  Basket b;
  int i;
  int nif;
  double weight;
  string local_b8;
  int local_98;
  int local_94;
  _Hash_node_base *local_90;
  Farm *local_88;
  double local_80;
  _Any_data local_78;
  code *local_68;
  code *pcStack_60;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  
  paVar1 = &local_b8.field_2;
  local_b8._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"Enter client\'s nif: ","");
  local_58._M_unused._M_object = (void *)0x0;
  local_58._8_8_ = 0;
  local_40 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/Utils.h:20:90)>
             ::_M_invoke;
  local_48 = std::
             _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Utils/Utils.h:20:90)>
             ::_M_manager;
  getOption(&local_94,&local_b8,(function<bool_(int)> *)&local_58);
  if (local_48 != (code *)0x0) {
    (*local_48)(&local_58,&local_58,__destroy_functor);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar1) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  iVar5 = local_94;
  bVar7 = searchClientByNIF(this,local_94);
  if (bVar7) {
    uVar2 = (this->baskets)._M_h._M_bucket_count;
    uVar9 = (ulong)(long)iVar5 % uVar2;
    p_Var11 = (this->baskets)._M_h._M_buckets[uVar9];
    p_Var12 = (__node_base_ptr)0x0;
    if ((p_Var11 != (__node_base_ptr)0x0) &&
       (p_Var13 = p_Var11->_M_nxt, p_Var12 = p_Var11, iVar5 != *(int *)&p_Var11->_M_nxt[1]._M_nxt))
    {
      while (p_Var11 = p_Var13, p_Var13 = p_Var11->_M_nxt, p_Var13 != (_Hash_node_base *)0x0) {
        p_Var12 = (__node_base_ptr)0x0;
        if (((ulong)(long)*(int *)&p_Var13[1]._M_nxt % uVar2 != uVar9) ||
           (p_Var12 = p_Var11, iVar5 == *(int *)&p_Var13[1]._M_nxt)) goto LAB_00124618;
      }
      p_Var12 = (__node_base_ptr)0x0;
    }
LAB_00124618:
    if (p_Var12 == (__node_base_ptr)0x0) {
      p_Var13 = (_Hash_node_base *)0x0;
    }
    else {
      p_Var13 = p_Var12->_M_nxt;
    }
    if (p_Var13 == (_Hash_node_base *)0x0) {
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Client doesn\'t have any active baskets to delivery!","");
      cinERR(&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ENTER to go back","");
      enterWait(&local_b8);
    }
    else {
      local_88 = this;
      line(0x14,'-');
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Client\'s baskets:",0x11);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      line(0x14,'-');
      local_98 = 0;
      p_Var3 = p_Var13[3]._M_nxt;
      local_90 = p_Var13;
      for (p_Var10 = p_Var13[2]._M_nxt; p_Var10 != p_Var3; p_Var10 = p_Var10 + 2) {
        local_b8._M_dataplus._M_p = (pointer)p_Var10->_M_nxt;
        local_b8._M_string_length = (size_type)p_Var10[1]._M_nxt;
        local_98 = local_98 + 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ID: ",4);
        poVar8 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_98);
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," | Weight: ",0xb);
        dVar4 = Basket::getWeight((Basket *)&local_b8);
        poVar8 = std::ostream::_M_insert<double>(dVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
        std::ostream::put((char)poVar8);
        std::ostream::flush();
      }
      paVar1 = &local_b8.field_2;
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Enter ID of the basket to be edited: ","");
      local_78._8_8_ = 0;
      local_78._M_unused._M_object = &local_98;
      pcStack_60 = std::
                   _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Context/Farm.cpp:224:61)>
                   ::_M_invoke;
      local_68 = std::
                 _Function_handler<bool_(int),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/antbz[P]CAL-Proj/src/Context/Farm.cpp:224:61)>
                 ::_M_manager;
      getOption(&local_94,&local_b8,(function<bool_(int)> *)&local_78);
      pFVar6 = local_88;
      if (local_68 != (code *)0x0) {
        (*local_68)(&local_78,&local_78,__destroy_functor);
      }
      p_Var13 = local_90;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_b8,"Enter basket\'s new weight: ","");
      getDouble(&local_80,&local_b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != paVar1) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      p_Var10 = p_Var13[2]._M_nxt;
      if ((ulong)((long)p_Var13[3]._M_nxt - (long)p_Var10 >> 4) <= (ulong)(long)local_94) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
      }
      Basket::setWeight((Basket *)(p_Var10 + (long)local_94 * 2),local_80);
      pFVar6->clientsFileChanged = true;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"Basket successfully edited!",0x1b);
      std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x28);
      std::ostream::put(-0x28);
      std::ostream::flush();
      local_b8._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ENTER to go back","");
      enterWait(&local_b8);
    }
  }
  else {
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,
               "ERROR: Doesn\'t exists a client with the given nif, please create a new one!","");
    cinERR(&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != paVar1) {
      operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
    }
    local_b8._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"ENTER to go back","");
    enterWait(&local_b8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Farm::editBasket() {
    int nif;

    getOption(nif, "Enter client's nif: ");
    if(!searchClientByNIF(nif)){
        cinERR("ERROR: Doesn't exists a client with the given nif, please create a new one!");
        enterWait();
        return;
    }

    const auto& cb_pair = baskets.find(nif);
    if(cb_pair == baskets.end()){
        cinERR("Client doesn't have any active baskets to delivery!");
        enterWait();
        return;
    }

    line(20);
    cout << "Client's baskets:" << endl;
    line(20);

    int i=0;
    for(Basket b: cb_pair->second){
        i++;
        cout << "ID: " << i << " | Weight: " << b.getWeight() << endl;
    }

    getOption(nif, "Enter ID of the basket to be edited: ", [&](int a){ return a > 0 && a < i; });

    double weight;
    getDouble(weight, "Enter basket's new weight: ");
    cb_pair->second.at(nif).setWeight(weight);

    clientsFileChanged = true;
    cout << "Basket successfully edited!" << endl;
    enterWait();
}